

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O0

uchar ** traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,void(*)(unsigned_char**,int,int),unsigned_short>
                   (TrieNode<unsigned_short> *node,uchar **dst,size_t depth,
                   _func_void_uchar_ptr_ptr_int_int *small_sort)

{
  EVP_PKEY_CTX *dst_00;
  bool bVar1;
  reference ppvVar2;
  size_type sVar3;
  size_t bsize;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket;
  uint local_2c;
  _func_void_uchar_ptr_ptr_int_int *p_Stack_28;
  uint i;
  _func_void_uchar_ptr_ptr_int_int *small_sort_local;
  size_t depth_local;
  uchar **dst_local;
  TrieNode<unsigned_short> *node_local;
  
  p_Stack_28 = small_sort;
  small_sort_local = (_func_void_uchar_ptr_ptr_int_int *)depth;
  depth_local = (size_t)dst;
  dst_local = (uchar **)node;
  for (local_2c = 0; local_2c < 0x10000; local_2c = local_2c + 1) {
    std::bitset<65536UL>::operator[]((bitset<65536UL> *)&bucket,(size_t)(dst_local + 0x10000));
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&bucket);
    std::bitset<65536UL>::reference::~reference((reference *)&bucket);
    if (bVar1) {
      ppvVar2 = std::array<void_*,_65536UL>::operator[]
                          ((array<void_*,_65536UL> *)dst_local,(ulong)local_2c);
      depth_local = (size_t)traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,void(*)(unsigned_char**,int,int),unsigned_short>
                                      ((TrieNode<unsigned_short> *)*ppvVar2,(uchar **)depth_local,
                                       (size_t)(small_sort_local + 2),p_Stack_28);
    }
    else {
      ppvVar2 = std::array<void_*,_65536UL>::operator[]
                          ((array<void_*,_65536UL> *)dst_local,(ulong)local_2c);
      dst_00 = (EVP_PKEY_CTX *)*ppvVar2;
      if (dst_00 != (EVP_PKEY_CTX *)0x0) {
        sVar3 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size
                          ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)dst_00);
        copy(dst_00,(EVP_PKEY_CTX *)depth_local);
        bVar1 = is_end<unsigned_int>(local_2c);
        if (!bVar1) {
          (*p_Stack_28)((uchar **)depth_local,(int)sVar3,(int)small_sort_local);
        }
        depth_local = sVar3 * 8 + depth_local;
        if (dst_00 != (EVP_PKEY_CTX *)0x0) {
          std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector
                    ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)dst_00);
          operator_delete(dst_00);
        }
      }
    }
  }
  if (dst_local != (uchar **)0x0) {
    operator_delete(dst_local);
  }
  return (uchar **)depth_local;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < max<CharT>::value; ++i) {
		if (node->is_trie[i]) {
			dst = traverse<BucketT>(
				static_cast<TrieNode<CharT>*>(node->buckets[i]),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}